

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::percolateUp
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  Var x;
  int k;
  bool bVar1;
  int *piVar2;
  int iVar3;
  
  piVar2 = (this->heap).data;
  x = piVar2[i];
  while( true ) {
    if (i == 0) break;
    iVar3 = i + -1 >> 1;
    bVar1 = Solver::VarOrderLt::operator()(&this->lt,x,piVar2[iVar3]);
    piVar2 = (this->heap).data;
    if (!bVar1) break;
    k = piVar2[iVar3];
    piVar2[i] = k;
    piVar2 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,k);
    *piVar2 = i;
    piVar2 = (this->heap).data;
    i = iVar3;
  }
  piVar2[i] = x;
  piVar2 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,x);
  *piVar2 = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        K   x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }